

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O2

RDL_cycleIterator * RDL_getRCyclesForURFIterator(RDL_data *data,uint index)

{
  uint bcc_index;
  uint urf_index;
  RDL_cycleIterator *pRVar1;
  
  if (data == (RDL_data *)0x0) {
    (*RDL_outputFunc)(RDL_ERROR,"RDL_data is NULL!\n");
  }
  else {
    if (index < data->nofURFs) {
      bcc_index = data->urf_to_bcc[index][0];
      urf_index = data->urf_to_bcc[index][1];
      pRVar1 = RDL_initCycleIterator
                         (RDL_URF_IT,0,0,urf_index,urf_index,bcc_index,bcc_index,'b',data);
      return pRVar1;
    }
    (*RDL_outputFunc)(RDL_ERROR,"invalid index: %u\n");
  }
  return (RDL_cycleIterator *)0x0;
}

Assistant:

RDL_cycleIterator* RDL_getRCyclesForURFIterator(const RDL_data *data, unsigned index)
{
  RDL_cycleIterator* it;
  unsigned urf_internal_index, bcc_index;

  if (!data) {
    RDL_outputFunc(RDL_ERROR, "RDL_data is NULL!\n");
    return NULL;
  }

  if (index >= data->nofURFs) {
    RDL_outputFunc(RDL_ERROR, "invalid index: %u\n", index);
    return NULL;
  }

  bcc_index = data->urf_to_bcc[index][0];
  urf_internal_index = data->urf_to_bcc[index][1];

  it = RDL_initCycleIterator(
      RDL_URF_IT,
      0, 0,
      urf_internal_index, urf_internal_index,
      bcc_index, bcc_index,
      'b', data);

  return it;
}